

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

int __thiscall Polynomial::createNotNode(Polynomial *this,int first_loc)

{
  int iVar1;
  initializer_list<int> __l;
  size_type sVar2;
  value_type_conflict2 local_7c;
  value_type local_78;
  allocator<int> local_45;
  int local_44;
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> args;
  int first_loc_local;
  Polynomial *this_local;
  
  args.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = first_loc;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->mEvaluationValues);
  this->mResultLocation = (int)sVar2;
  local_44 = args.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_;
  local_40 = &local_44;
  local_38 = 1;
  std::allocator<int>::allocator(&local_45);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,__l,&local_45);
  std::allocator<int>::~allocator(&local_45);
  local_78.op = NOT;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_78.args,(vector<int,_std::allocator<int>_> *)local_30);
  std::vector<Polynomial::operand,_std::allocator<Polynomial::operand>_>::push_back
            (&this->mOperands,&local_78);
  operand::~operand(&local_78);
  local_7c = 0;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mEvaluationValues,&local_7c);
  iVar1 = this->mResultLocation;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return iVar1;
}

Assistant:

int Polynomial::createNotNode(int first_loc)
{
  mResultLocation = mEvaluationValues.size();
  std::vector<int> args { first_loc };
  mOperands.push_back({operandType::NOT, args});
  mEvaluationValues.push_back(0); // make space in evaluation array for the output.
  return mResultLocation;
}